

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btKinematicCharacterController.cpp
# Opt level: O2

void __thiscall
btKinematicCharacterController::preStep
          (btKinematicCharacterController *this,btCollisionWorld *collisionWorld)

{
  btPairCachingGhostObject *pbVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  btVector3 bVar6;
  btScalar local_50;
  btScalar local_4c;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  this->m_touchingContact = false;
  uVar3 = *(undefined8 *)((this->m_platformLinearVelocity).m_floats + 2);
  *(undefined8 *)(this->m_newPlatformLinearVelocity).m_floats =
       *(undefined8 *)(this->m_platformLinearVelocity).m_floats;
  *(undefined8 *)((this->m_newPlatformLinearVelocity).m_floats + 2) = uVar3;
  iVar5 = 5;
  do {
    bVar4 = recoverFromPenetration(this,collisionWorld);
    if (!bVar4) break;
    this->m_touchingContact = true;
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  local_4c = 0.0;
  bVar6 = operator*(&this->m_platformLinearVelocity,&local_4c);
  local_48._8_4_ = extraout_XMM0_Dc;
  local_48._0_8_ = bVar6.m_floats._0_8_;
  local_48._12_4_ = extraout_XMM0_Dd;
  local_38._8_4_ = in_XMM1_Dc;
  local_38._0_8_ = bVar6.m_floats._8_8_;
  local_38._12_4_ = in_XMM1_Dd;
  local_50 = 1.0;
  bVar6 = operator*(&this->m_newPlatformLinearVelocity,&local_50);
  auVar2._4_4_ = bVar6.m_floats[1] + (float)local_48._4_4_;
  auVar2._0_4_ = bVar6.m_floats[0] + (float)local_48._0_4_;
  auVar2._8_4_ = bVar6.m_floats[2] + (float)local_38._0_4_;
  auVar2._12_4_ = 0;
  *(undefined1 (*) [16])(this->m_platformLinearVelocity).m_floats = auVar2;
  pbVar1 = this->m_ghostObject;
  uVar3 = *(undefined8 *)
           ((pbVar1->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_origin.m_floats
           + 2);
  *(undefined8 *)(this->m_currentPosition).m_floats =
       *(undefined8 *)
        (pbVar1->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_origin.m_floats;
  *(undefined8 *)((this->m_currentPosition).m_floats + 2) = uVar3;
  uVar3 = *(undefined8 *)
           ((pbVar1->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_origin.m_floats
           + 2);
  *(undefined8 *)(this->m_targetPosition).m_floats =
       *(undefined8 *)
        (pbVar1->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_origin.m_floats;
  *(undefined8 *)((this->m_targetPosition).m_floats + 2) = uVar3;
  return;
}

Assistant:

void btKinematicCharacterController::preStep (  btCollisionWorld* collisionWorld)
{

	int numPenetrationLoops = 0;
	m_touchingContact = false;
	m_newPlatformLinearVelocity = m_platformLinearVelocity;

	while (recoverFromPenetration (collisionWorld))
	{
		numPenetrationLoops++;
		m_touchingContact = true;
		if (numPenetrationLoops > 4)
		{
			//printf("character could not recover from penetration = %d\n", numPenetrationLoops);
			break;
		}
	}

	auto platformVelocityResponseAlpha = 1.0;
	m_platformLinearVelocity = m_platformLinearVelocity*(1.0f - platformVelocityResponseAlpha) + m_newPlatformLinearVelocity*platformVelocityResponseAlpha;

	m_currentPosition = m_ghostObject->getWorldTransform().getOrigin();
	m_targetPosition = m_currentPosition;
//	printf("m_targetPosition=%f,%f,%f\n",m_targetPosition[0],m_targetPosition[1],m_targetPosition[2]);


}